

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

z_size_t gz_read(gz_statep state,voidp buf,z_size_t len)

{
  int iVar1;
  uint local_34;
  z_size_t zStack_30;
  uint n;
  z_size_t got;
  z_size_t len_local;
  voidp buf_local;
  gz_statep state_local;
  
  if (len == 0) {
    return 0;
  }
  got = len;
  len_local = (z_size_t)buf;
  buf_local = state;
  if (state->seek != 0) {
    state->seek = 0;
    iVar1 = gz_skip(state,state->skip);
    if (iVar1 == -1) {
      return 0;
    }
  }
  zStack_30 = 0;
  do {
    local_34 = 0xffffffff;
    if (got < 0xffffffff) {
      local_34 = (uint)got;
    }
    if (*buf_local == 0) {
      if ((*(int *)((long)buf_local + 0x50) != 0) && (*(int *)((long)buf_local + 0x88) == 0)) {
        *(undefined4 *)((long)buf_local + 0x54) = 1;
        return zStack_30;
      }
      if ((*(int *)((long)buf_local + 0x44) != 0) &&
         ((uint)(*(int *)((long)buf_local + 0x28) << 1) <= local_34)) {
        if (*(int *)((long)buf_local + 0x44) == 1) {
          iVar1 = gz_load((gz_statep)buf_local,(uchar *)len_local,local_34,&local_34);
          if (iVar1 == -1) {
            return 0;
          }
        }
        else {
          *(uint *)((long)buf_local + 0xa0) = local_34;
          *(z_size_t *)((long)buf_local + 0x98) = len_local;
          iVar1 = gz_decomp((gz_statep)buf_local);
          if (iVar1 == -1) {
            return 0;
          }
          local_34 = *buf_local;
          *(undefined4 *)buf_local = 0;
        }
        goto LAB_00f8ac4a;
      }
      iVar1 = gz_fetch((gz_statep)buf_local);
      if (iVar1 == -1) {
        return 0;
      }
    }
    else {
      if (*buf_local < local_34) {
        local_34 = *buf_local;
      }
      memcpy((void *)len_local,*(void **)((long)buf_local + 8),(ulong)local_34);
      *(ulong *)((long)buf_local + 8) = *(long *)((long)buf_local + 8) + (ulong)local_34;
      *(uint *)buf_local = *buf_local - local_34;
LAB_00f8ac4a:
      got = got - local_34;
      len_local = len_local + local_34;
      zStack_30 = zStack_30 + local_34;
      *(ulong *)((long)buf_local + 0x10) = (ulong)local_34 + *(long *)((long)buf_local + 0x10);
    }
    if (got == 0) {
      return zStack_30;
    }
  } while( true );
}

Assistant:

local z_size_t gz_read(gz_statep state, voidp buf, z_size_t len) {
    z_size_t got;
    unsigned n;

    /* if len is zero, avoid unnecessary operations */
    if (len == 0)
        return 0;

    /* process a skip request */
    if (state->seek) {
        state->seek = 0;
        if (gz_skip(state, state->skip) == -1)
            return 0;
    }

    /* get len bytes to buf, or less than len if at the end */
    got = 0;
    do {
        /* set n to the maximum amount of len that fits in an unsigned int */
        n = (unsigned)-1;
        if (n > len)
            n = (unsigned)len;

        /* first just try copying data from the output buffer */
        if (state->x.have) {
            if (state->x.have < n)
                n = state->x.have;
            memcpy(buf, state->x.next, n);
            state->x.next += n;
            state->x.have -= n;
        }

        /* output buffer empty -- return if we're at the end of the input */
        else if (state->eof && state->strm.avail_in == 0) {
            state->past = 1;        /* tried to read past end */
            break;
        }

        /* need output data -- for small len or new stream load up our output
           buffer */
        else if (state->how == LOOK || n < (state->size << 1)) {
            /* get more output, looking for header if required */
            if (gz_fetch(state) == -1)
                return 0;
            continue;       /* no progress yet -- go back to copy above */
            /* the copy above assures that we will leave with space in the
               output buffer, allowing at least one gzungetc() to succeed */
        }

        /* large len -- read directly into user buffer */
        else if (state->how == COPY) {      /* read directly */
            if (gz_load(state, (unsigned char *)buf, n, &n) == -1)
                return 0;
        }

        /* large len -- decompress directly into user buffer */
        else {  /* state->how == GZIP */
            state->strm.avail_out = n;
            state->strm.next_out = (unsigned char *)buf;
            if (gz_decomp(state) == -1)
                return 0;
            n = state->x.have;
            state->x.have = 0;
        }

        /* update progress */
        len -= n;
        buf = (char *)buf + n;
        got += n;
        state->x.pos += n;
    } while (len);

    /* return number of bytes read into user buffer */
    return got;
}